

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

bootstrap_analysis *
Catch::Benchmark::Detail::analyse_samples
          (bootstrap_analysis *__return_storage_ptr__,double confidence_level,uint n_resamples,
          iterator first,iterator last)

{
  double dVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double sb;
  Estimate<double> stddev_estimate;
  Estimate<double> mean_estimate;
  anon_class_32_4_6f2d8bc5 Estimate;
  Estimate<double> local_b0;
  Estimate<double> local_90;
  anon_class_32_4_6f2d8bc5 local_70;
  anon_class_32_4_9b8c116d local_50;
  
  if (analyse_samples(double,unsigned_int,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>)
      ::entropy == '\0') {
    iVar2 = __cxa_guard_acquire(&analyse_samples(double,unsigned_int,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>)
                                 ::entropy);
    if (iVar2 != 0) {
      std::random_device::random_device(&analyse_samples::entropy);
      __cxa_atexit(std::random_device::~random_device,&analyse_samples::entropy,&__dso_handle);
      __cxa_guard_release(&analyse_samples(double,unsigned_int,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>)
                           ::entropy);
    }
  }
  local_70.n_resamples = n_resamples;
  local_70.first._M_current = first._M_current;
  local_70.last._M_current = last._M_current;
  local_70.confidence_level = confidence_level;
  analyse_samples::anon_class_32_4_6f2d8bc5::operator()(&local_90,&local_70,mean);
  analyse_samples::anon_class_32_4_6f2d8bc5::operator()
            (&local_b0,&local_70,anon_unknown_12::standard_deviation);
  dVar8 = local_b0.point;
  local_50.n = (int)((ulong)((long)last._M_current - (long)first._M_current) >> 3);
  dVar10 = (double)local_50.n;
  local_50.mn = local_90.point / dVar10;
  dVar5 = local_50.mn * 0.5;
  dVar11 = dVar5 * 0.25;
  if (dVar10 < 0.0) {
    dVar1 = sqrt(dVar10);
  }
  else {
    dVar1 = SQRT(dVar10);
  }
  dVar9 = dVar8 / dVar1;
  if (dVar11 <= dVar8 / dVar1) {
    dVar9 = dVar11;
  }
  dVar8 = dVar8 * dVar8;
  dVar9 = dVar9 * dVar9;
  local_50.sb2 = dVar8;
  local_50.sg2 = dVar9;
  dVar11 = anon_unknown_12::outlier_variance::anon_class_32_4_9b8c116d::operator()(&local_50,0.0);
  dVar5 = anon_unknown_12::outlier_variance::anon_class_32_4_9b8c116d::operator()(&local_50,dVar5);
  uVar3 = SUB84(dVar5,0);
  uVar4 = (undefined4)((ulong)dVar5 >> 0x20);
  if (dVar11 <= dVar5) {
    uVar3 = SUB84(dVar11,0);
    uVar4 = (undefined4)((ulong)dVar11 >> 0x20);
  }
  auVar6._0_8_ = dVar10 - (double)CONCAT44(uVar4,uVar3);
  auVar6._8_8_ = dVar10 + -1.0;
  auVar7._8_8_ = dVar10;
  auVar7._0_8_ = dVar10;
  auVar7 = divpd(auVar6,auVar7);
  dVar5 = (dVar8 - dVar9 * auVar6._0_8_) * auVar7._0_8_;
  dVar10 = (dVar8 - dVar9 * (dVar10 + -1.0)) * auVar7._8_8_;
  if (dVar10 <= dVar5) {
    dVar5 = dVar10;
  }
  (__return_storage_ptr__->mean).upper_bound = local_90.upper_bound;
  (__return_storage_ptr__->mean).confidence_interval = local_90.confidence_interval;
  (__return_storage_ptr__->mean).point = local_90.point;
  (__return_storage_ptr__->mean).lower_bound = local_90.lower_bound;
  (__return_storage_ptr__->standard_deviation).upper_bound = local_b0.upper_bound;
  (__return_storage_ptr__->standard_deviation).confidence_interval = local_b0.confidence_interval;
  (__return_storage_ptr__->standard_deviation).point = local_b0.point;
  (__return_storage_ptr__->standard_deviation).lower_bound = local_b0.lower_bound;
  __return_storage_ptr__->outlier_variance = dVar5 / dVar8;
  return __return_storage_ptr__;
}

Assistant:

bootstrap_analysis analyse_samples(double confidence_level,
                                               unsigned int n_resamples,
                                               std::vector<double>::iterator first,
                                               std::vector<double>::iterator last) {
                CATCH_INTERNAL_START_WARNINGS_SUPPRESSION
                CATCH_INTERNAL_SUPPRESS_GLOBALS_WARNINGS
                static std::random_device entropy;
                CATCH_INTERNAL_STOP_WARNINGS_SUPPRESSION

                auto n = static_cast<int>(last - first); // seriously, one can't use integral types without hell in C++

                auto mean = &Detail::mean;
                auto stddev = &standard_deviation;

#if defined(CATCH_CONFIG_USE_ASYNC)
                auto Estimate = [=](double(*f)(std::vector<double>::const_iterator,
                                               std::vector<double>::const_iterator)) {
                    auto seed = entropy();
                    return std::async(std::launch::async, [=] {
                        std::mt19937 rng(seed);
                        auto resampled = resample(rng, n_resamples, first, last, f);
                        return bootstrap(confidence_level, first, last, resampled, f);
                    });
                };

                auto mean_future = Estimate(mean);
                auto stddev_future = Estimate(stddev);

                auto mean_estimate = mean_future.get();
                auto stddev_estimate = stddev_future.get();
#else
                auto Estimate = [=](double(*f)(std::vector<double>::const_iterator,
                                               std::vector<double>::const_iterator)) {
                    auto seed = entropy();
                    std::mt19937 rng(seed);
                    auto resampled = resample(rng, n_resamples, first, last, f);
                    return bootstrap(confidence_level, first, last, resampled, f);
                };

                auto mean_estimate = Estimate(mean);
                auto stddev_estimate = Estimate(stddev);
#endif // CATCH_USE_ASYNC

                double outlier_variance = Detail::outlier_variance(mean_estimate, stddev_estimate, n);

                return { mean_estimate, stddev_estimate, outlier_variance };
            }